

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pbVar2;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  pointer ppcVar15;
  string_view varg1;
  string_view str;
  string_view str_00;
  ulong uStack_260;
  bool SRArgumentSpecified;
  ulong local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> presetName;
  string arg;
  _Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_1e0;
  char *local_1c8 [4];
  string errormsg;
  
  SRArgumentSpecified = false;
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
              InitialCommandLineArguments,args);
  __it._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,__it._M_current,"--list-presets"
                        );
  this_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uStack_260 = (long)pbVar1 - (long)this_00;
  for (lVar11 = (long)uStack_260 >> 7; pbVar12 = local_240, 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_00,__it);
    pbVar12 = local_240;
    pbVar14 = this_00;
    if (bVar4) goto LAB_00158b15;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)(this_00 + 1),__it);
    pbVar12 = local_240;
    pbVar14 = this_00 + 1;
    if (bVar4) goto LAB_00158b15;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)(this_00 + 2),__it);
    pbVar12 = local_240;
    pbVar14 = this_00 + 2;
    if (bVar4) goto LAB_00158b15;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)(this_00 + 3),__it);
    pbVar12 = local_240;
    pbVar14 = this_00 + 3;
    if (bVar4) goto LAB_00158b15;
    this_00 = this_00 + 4;
    uStack_260 = uStack_260 - 0x80;
  }
  uStack_260 = (long)uStack_260 >> 5;
  if (uStack_260 == 1) {
LAB_001590ac:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_00,__it);
    pbVar14 = this_00;
    if (!bVar4) {
      pbVar14 = pbVar1;
    }
  }
  else if (uStack_260 == 2) {
LAB_00158af4:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_00,__it);
    pbVar14 = this_00;
    if (!bVar4) {
      this_00 = this_00 + 1;
      goto LAB_001590ac;
    }
  }
  else {
    pbVar14 = pbVar1;
    if ((uStack_260 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                              *)this_00,__it), pbVar14 = this_00, !bVar4)) {
      this_00 = this_00 + 1;
      goto LAB_00158af4;
    }
  }
LAB_00158b15:
  if (pbVar12 == pbVar1) {
    if (pbVar14 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00158c22;
    errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
    errormsg._M_string_length = 0;
    errormsg.field_2._M_local_buf[0] = '\0';
    str._M_str = (pbVar14->_M_dataplus)._M_p;
    str._M_len = pbVar14->_M_string_length;
    bVar4 = cmHasLiteralPrefix<10ul>(str,(char (*) [10])"--preset=");
    if (bVar4) {
      std::__cxx11::string::substr((ulong)&presetName,(ulong)pbVar14);
      bVar4 = SetArgsFromPreset(this,&presetName,false);
    }
    else {
      if (pbVar14 + 1 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&presetName,"\'--preset\' requires an argument",(allocator<char> *)&arg
                  );
        cmSystemTools::Error(&presetName);
        std::__cxx11::string::~string((string *)&presetName);
        uStack_260 = 1;
        goto LAB_00158b6d;
      }
      std::__cxx11::string::string((string *)&presetName,(string *)(pbVar14 + 1));
      bVar4 = SetArgsFromPreset(this,&presetName,false);
    }
    std::__cxx11::string::~string((string *)&presetName);
    uStack_260 = 1;
  }
  else {
    errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
    errormsg._M_string_length = 0;
    errormsg.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&presetName,"",(allocator<char> *)&arg);
    bVar4 = SetArgsFromPreset(this,&presetName,true);
    std::__cxx11::string::~string((string *)&presetName);
    uStack_260 = (ulong)!bVar4;
LAB_00158b6d:
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&errormsg);
  if (bVar4 == false) {
    return (int)uStack_260;
  }
LAB_00158c22:
  bVar13 = 1;
  local_248 = 1;
  bVar4 = false;
  do {
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= local_248) {
      _Var10._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      if ((_Var10._M_head_impl)->ParallelLevelSetInCli == false) {
        errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
        errormsg._M_string_length = 0;
        errormsg.field_2._M_local_buf[0] = '\0';
        bVar5 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&errormsg);
        if (bVar5) {
          iVar9 = atoi(errormsg._M_dataplus._M_p);
          iVar8 = 1;
          if (1 < iVar9) {
            iVar8 = iVar9;
          }
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar8;
        }
        std::__cxx11::string::~string((string *)&errormsg);
        _Var10._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      if (((_Var10._M_head_impl)->TestProgressOutput == true) &&
         ((_Head_base<0UL,_cmGeneratedFileStream_*,_false>)
          *(_Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> *
           )&((_Var10._M_head_impl)->OutputLogFile)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
          == (cmGeneratedFileStream *)0x0)) {
        bVar5 = ConsoleIsNotDumb();
        _Var10._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      else {
        bVar5 = false;
      }
      (_Var10._M_head_impl)->TestProgressOutput = bVar5;
      if (bVar4) {
        iVar8 = RunCMakeAndTest(this,output);
      }
      else if (bVar13 == 0) {
        iVar8 = 1;
      }
      else {
        iVar8 = ExecuteTests(this);
      }
      return iVar8;
    }
    presetName._M_dataplus._M_p = (pointer)&presetName.field_2;
    presetName._M_string_length = 0;
    presetName.field_2._M_local_buf[0] = '\0';
    bVar5 = HandleCommandLineArguments(this,&local_248,args,&presetName);
    if (bVar5) {
      HandleScriptArguments(this,&local_248,args,&SRArgumentSpecified);
      std::__cxx11::string::string
                ((string *)&arg,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_248));
      varg1._M_str = "--dashboard";
      varg1._M_len = (size_t)"-D";
      bVar5 = CheckArgument((cmCTest *)&arg,(string *)0x2,varg1,in_R8);
      if ((bVar5) &&
         (pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_248 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
        local_248 = local_248 + 1;
        std::__cxx11::string::string((string *)&errormsg,(string *)(pbVar2 + local_248));
        bVar5 = AddTestsForDashboardType(this,&errormsg);
        if ((!bVar5) && (bVar5 = AddVariableDefinition(this,&errormsg), !bVar5)) {
          ErrorMessageUnknownDashDValue(this,&errormsg);
          bVar13 = 0;
        }
        std::__cxx11::string::~string((string *)&errormsg);
      }
      bVar5 = std::operator!=(&arg,"-D");
      if ((bVar5) &&
         (str_00._M_str = arg._M_dataplus._M_p, str_00._M_len = arg._M_string_length,
         bVar5 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0x644e7c), bVar5)) {
        std::__cxx11::string::substr((ulong)&errormsg,(ulong)&arg);
        AddVariableDefinition(this,&errormsg);
        std::__cxx11::string::~string((string *)&errormsg);
      }
      bVar5 = HandleTestActionArgument(this,"ctest",&local_248,args);
      local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT71(local_240._1_7_,bVar5);
      bVar6 = HandleTestModelArgument(this,"ctest",&local_248,args);
      bVar5 = CheckArgument((cmCTest *)&arg,(string *)0xe,(string_view)ZEXT816(0x5fed8c),in_R8);
      if ((bVar5) &&
         (local_248 <
          ((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errormsg,"Submit",(allocator<char> *)local_1c8);
        SetTest(this,&errormsg,true);
        std::__cxx11::string::~string((string *)&errormsg);
        local_248 = local_248 + 1;
        bVar7 = SubmitExtraFiles(this,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + local_248);
        bVar5 = false;
        if (bVar7) goto LAB_00158e50;
        uStack_260 = 0;
      }
      else {
LAB_00158e50:
        bVar5 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000010,(string_view)ZEXT816(0x5fcf3d)
                              ,in_R8);
        if (bVar5) {
          bVar4 = (bool)(bVar4 | local_248 <
                                 ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        bVar5 = CheckArgument((cmCTest *)&arg,(string *)&DAT_00000011,(string_view)ZEXT816(0x5fd400)
                              ,in_R8);
        if (bVar5) {
          std::__cxx11::string::assign
                    ((char *)&((this->Impl)._M_t.
                               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                               .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                              ScheduleType);
        }
        Private::GetTestingHandlers
                  ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                   &local_1e0,
                   (this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl);
        ppcVar3 = local_1e0._M_impl.super__Vector_impl_data._M_finish;
        ppcVar15 = local_1e0._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar5 = ppcVar15 == ppcVar3;
          if (bVar5) goto LAB_00158fa0;
          iVar8 = (*(*ppcVar15)->_vptr_cmCTestGenericHandler[2])(*ppcVar15,&arg,&local_248,args);
          ppcVar15 = ppcVar15 + 1;
        } while (iVar8 != 0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
        std::operator<<((ostream *)&errormsg,
                        "Problem parsing command line arguments within a handler");
        std::__cxx11::stringbuf::str();
        in_R8 = local_1c8[0];
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xaca,local_1c8[0],false);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errormsg);
        uStack_260 = 0;
LAB_00158fa0:
        std::_Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::
        ~_Vector_base(&local_1e0);
      }
      bVar13 = bVar13 & (byte)local_240 & bVar6;
      std::__cxx11::string::~string((string *)&arg);
    }
    else {
      cmSystemTools::Error(&presetName);
      bVar5 = false;
      uStack_260 = 1;
    }
    std::__cxx11::string::~string((string *)&presetName);
    if (!bVar5) {
      return (int)uStack_260;
    }
    local_248 = local_248 + 1;
  } while( true );
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cm::append(this->Impl->InitialCommandLineArguments, args);

  // check if a test preset was specified

  bool listPresets =
    find(args.begin(), args.end(), "--list-presets") != args.end();
  auto it =
    std::find_if(args.begin(), args.end(), [](std::string const& arg) -> bool {
      return arg == "--preset" || cmHasLiteralPrefix(arg, "--preset=");
    });
  if (listPresets || it != args.end()) {
    std::string errormsg;
    bool success;

    if (listPresets) {
      // If listing presets we don't need a presetName
      success = this->SetArgsFromPreset("", listPresets);
    } else {
      if (cmHasLiteralPrefix(*it, "--preset=")) {
        auto presetName = it->substr(9);
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else if (++it != args.end()) {
        auto presetName = *it;
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else {
        cmSystemTools::Error("'--preset' requires an argument");
        success = false;
      }
    }

    if (listPresets) {
      return success ? 0 : 1;
    }

    if (!success) {
      return 1;
    }
  }

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D"_s, "--dashboard") &&
        i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmHasLiteralPrefix(arg, "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit"_s) && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i])) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test"_s) &&
        i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random"_s)) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but it may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}